

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

double calculate_sd<dense_parameters>(vw *param_1,dense_parameters *weights)

{
  dense_iterator<float> __first;
  dense_iterator<float> __first_00;
  dense_iterator<float> __last;
  dense_iterator<float> __last_00;
  long lVar1;
  double sq_sum;
  vector<double,_std::allocator<double>_> diff;
  double mean;
  double sum;
  dense_parameters *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  double dVar2;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  anon_class_8_1_898ec0c3 local_e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Stack_e0;
  double *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  double local_c0;
  undefined1 local_a1 [25];
  double local_88;
  dense_parameters *local_80;
  size_type sStack_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  double local_50;
  dense_parameters *local_40;
  
  dense_parameters::begin(in_stack_fffffffffffffea0);
  dense_parameters::end(in_stack_fffffffffffffea0);
  std::
  for_each<dense_iterator<float>,calculate_sd<dense_parameters>(vw&,dense_parameters&)::_lambda(float)_1_>
            ();
  dense_parameters::begin(local_40);
  dense_parameters::end(local_40);
  __first._begin = (float *)in_stack_fffffffffffffeb8;
  __first._current = (float *)local_70;
  __first._16_8_ = in_stack_fffffffffffffec0;
  __last._begin = (float *)in_stack_fffffffffffffed0;
  __last._current = (float *)in_stack_fffffffffffffec8;
  __last._16_8_ = in_stack_fffffffffffffed8;
  local_50 = std::accumulate<dense_iterator<float>,double>(__first,__last,(double)local_80);
  local_88 = local_50 / (double)calculate_sd<dense_parameters>::my_size;
  lVar1 = (long)calculate_sd<dense_parameters>::my_size;
  puVar3 = local_a1;
  std::allocator<double>::allocator((allocator<double> *)0x1bb0e1);
  std::vector<double,_std::allocator<double>_>::vector
            (local_70,sStack_78,(allocator_type *)local_80);
  std::allocator<double>::~allocator((allocator<double> *)0x1bb107);
  dense_parameters::begin(local_80);
  dense_parameters::end(local_80);
  std::vector<double,_std::allocator<double>_>::begin(local_68);
  __first_00._begin = (float *)in_stack_fffffffffffffec8;
  __first_00._current = (float *)in_stack_fffffffffffffec0;
  __first_00._16_8_ = lVar1;
  __last_00._begin = (float *)in_stack_fffffffffffffee0;
  __last_00._current = (float *)puVar3;
  __last_00._16_8_ = in_stack_fffffffffffffee8;
  std::
  transform<dense_iterator<float>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,calculate_sd<dense_parameters>(vw&,dense_parameters&)::_lambda(double)_1_>
            (__first_00,__last_00,_Stack_e0,local_e8);
  std::vector<double,_std::allocator<double>_>::begin(local_d0);
  std::vector<double,_std::allocator<double>_>::end(local_d0);
  std::vector<double,_std::allocator<double>_>::begin(local_d0);
  dVar2 = std::
          inner_product<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_d8,_Stack_e0,local_e8.mean,local_c0);
  dVar2 = sqrt(dVar2 / (double)calculate_sd<dense_parameters>::my_size);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e8.mean);
  return dVar2;
}

Assistant:

double calculate_sd(vw& /* all */, T& weights)
{
  static int my_size = 0;
  for_each(weights.begin(), weights.end(), [](float /* v */) { my_size += 1; });
  double sum = accumulate(weights.begin(), weights.end(), 0.0);
  double mean = sum / my_size;
  vector<double> diff(my_size);
  transform(weights.begin(), weights.end(), diff.begin(), [mean](double x) { return x - mean; });
  double sq_sum = inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
  return sqrt(sq_sum / my_size);
}